

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11.cpp
# Opt level: O2

void __thiscall tcu::x11::XlibWindow::getDimensions(XlibWindow *this,int *width,int *height)

{
  uint height_;
  uint width_;
  uint depth;
  uint borderWidth;
  int y;
  int x;
  Window root;
  
  XGetGeometry(this->m_display->m_display,this->m_window,&root,&x,&y,&width_,&height_,&borderWidth,
               &depth);
  if (width != (int *)0x0) {
    *width = width_;
  }
  if (height != (int *)0x0) {
    *height = height_;
  }
  return;
}

Assistant:

void XlibWindow::getDimensions (int* width, int* height) const
{
	int x, y;
	::Window root;
	unsigned width_, height_, borderWidth, depth;

	XGetGeometry(m_display.getXDisplay(), m_window, &root, &x, &y, &width_, &height_, &borderWidth, &depth);
	if (width != DE_NULL)
		*width = static_cast<int>(width_);
	if (height != DE_NULL)
		*height = static_cast<int>(height_);
}